

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

void Omega_h::map_into<int>(Read<int> *a_data,Graph *a2b,Write<int> *b_data,Int width)

{
  Write<int> local_98;
  Read<int> local_88;
  Read<int> local_78 [2];
  Read<int> local_58;
  Read<int> local_48;
  undefined1 local_38 [8];
  Read<int> ab_data;
  Int width_local;
  Write<int> *b_data_local;
  Graph *a2b_local;
  Read<int> *a_data_local;
  
  ab_data.write_.shared_alloc_.direct_ptr._4_4_ = width;
  Read<int>::Read(&local_48,a_data);
  Read<int>::Read(&local_58,&a2b->a2ab);
  expand<int>((Omega_h *)local_38,&local_48,&local_58,ab_data.write_.shared_alloc_.direct_ptr._4_4_)
  ;
  Read<int>::~Read(&local_58);
  Read<int>::~Read(&local_48);
  Read<int>::Read(local_78,(Read<int> *)local_38);
  Read<int>::Read(&local_88,&a2b->ab2b);
  Write<int>::Write(&local_98,b_data);
  map_into<int>(local_78,&local_88,&local_98,ab_data.write_.shared_alloc_.direct_ptr._4_4_);
  Write<int>::~Write(&local_98);
  Read<int>::~Read(&local_88);
  Read<int>::~Read(local_78);
  Read<int>::~Read((Read<int> *)local_38);
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}